

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O1

Aig_Man_t * Aig_ManStart(int nNodesMax)

{
  uint uVar1;
  Aig_Man_t *__s;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  Aig_MmFixed_t *p;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **__s_00;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  iVar6 = 0x2717;
  if (0 < nNodesMax) {
    iVar6 = nNodesMax;
  }
  __s = (Aig_Man_t *)malloc(0x210);
  memset(__s,0,0x210);
  __s->nTravIds = 1;
  __s->fCatchExor = 0;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  __s->vCis = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  __s->vCos = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  __s->vObjs = pVVar2;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar4->pArray = ppvVar3;
  __s->vBufs = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 8;
  pVVar4->nSize = 0;
  ppvVar3 = (void **)malloc(0x40);
  pVVar4->pArray = ppvVar3;
  __s->unfold2_type_I = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 8;
  pVVar4->nSize = 0;
  ppvVar3 = (void **)malloc(0x40);
  pVVar4->pArray = ppvVar3;
  __s->unfold2_type_II = pVVar4;
  p = Aig_MmFixedStart(0x30,iVar6);
  __s->pMemObjs = p;
  pAVar5 = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p);
  (pAVar5->field_0).pNext = (Aig_Obj_t *)0x0;
  pAVar5->pFanin0 = (Aig_Obj_t *)0x0;
  pAVar5->pFanin1 = (Aig_Obj_t *)0x0;
  *(undefined8 *)&pAVar5->field_0x18 = 0;
  pAVar5->TravId = 0;
  pAVar5->Id = 0;
  (pAVar5->field_5).pData = (void *)0x0;
  uVar7 = pVVar2->nSize;
  pAVar5->Id = uVar7;
  uVar1 = pVVar2->nCap;
  if (uVar7 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
      }
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar1 * 2;
      if (iVar9 <= (int)uVar1) goto LAB_006b65cb;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
    }
    pVVar2->pArray = ppvVar3;
    pVVar2->nCap = iVar9;
  }
LAB_006b65cb:
  iVar9 = pVVar2->nSize;
  pVVar2->nSize = iVar9 + 1;
  pVVar2->pArray[iVar9] = pAVar5;
  __s->pConst1 = pAVar5;
  *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xfffffffffffffff0 | 9;
  __s->nObjs[1] = __s->nObjs[1] + 1;
  uVar7 = iVar6 - 1;
  while( true ) {
    do {
      uVar8 = uVar7 + 1;
      uVar1 = uVar7 & 1;
      uVar7 = uVar8;
    } while (uVar1 != 0);
    if (uVar8 < 9) break;
    iVar6 = 5;
    while( true ) {
      if (uVar8 % (iVar6 - 2U) == 0) break;
      uVar1 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar8 < uVar1) goto LAB_006b6626;
    }
  }
LAB_006b6626:
  __s->nTableSize = uVar8;
  __s_00 = (Aig_Obj_t **)malloc((long)(int)uVar8 << 3);
  __s->pTable = __s_00;
  memset(__s_00,0,(long)(int)uVar8 << 3);
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description [The argument of this procedure is a soft limit on the
  the number of nodes, or 0 if the limit is unknown.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Aig_ManStart( int nNodesMax )
{
    Aig_Man_t * p;
    if ( nNodesMax <= 0 )
        nNodesMax = 10007;
    // start the manager
    p = ABC_ALLOC( Aig_Man_t, 1 );
    memset( p, 0, sizeof(Aig_Man_t) );
    // perform initializations
    p->nTravIds = 1;
    p->fCatchExor = 0;
    // allocate arrays for nodes
    p->vCis  = Vec_PtrAlloc( 100 );
    p->vCos  = Vec_PtrAlloc( 100 );
    p->vObjs = Vec_PtrAlloc( 1000 );
    p->vBufs = Vec_PtrAlloc( 100 );
    //--jlong -- begin
       p->unfold2_type_I = Vec_PtrAlloc( 4);
       p->unfold2_type_II = Vec_PtrAlloc( 4);
       //--jlong -- end
    // prepare the internal memory manager
    p->pMemObjs = Aig_MmFixedStart( sizeof(Aig_Obj_t), nNodesMax );
    // create the constant node
    p->pConst1 = Aig_ManFetchMemory( p );
    p->pConst1->Type = AIG_OBJ_CONST1;
    p->pConst1->fPhase = 1;
    p->nObjs[AIG_OBJ_CONST1]++;
    // start the table
    p->nTableSize = Abc_PrimeCudd( nNodesMax );
    p->pTable = ABC_ALLOC( Aig_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    return p;
}